

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

void __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool second_dash)

{
  pointer *pppOVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  Option *pOVar4;
  iterator iVar5;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar6;
  pointer pbVar7;
  _Alloc_hider _Var8;
  uint uVar9;
  bool bVar10;
  Classifer CVar11;
  HorribleError *pHVar12;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var13;
  size_t sVar14;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var15;
  ArgumentMismatch *__return_storage_ptr__;
  undefined7 in_register_00000011;
  int iVar16;
  pointer pbVar17;
  uint uVar18;
  string current_;
  Classifer current_type;
  string rest;
  string name;
  string current;
  string value;
  undefined1 local_228 [36];
  Classifer local_204;
  string local_200;
  string local_1e0;
  string local_1c0;
  _Head_base<0UL,_CLI::Option_*,_false> local_1a0;
  value_type local_198;
  string local_178;
  value_type local_158;
  value_type local_138;
  value_type local_118;
  value_type local_f8;
  string local_d8;
  string local_b8;
  anon_class_40_2_8d6d5393_for__M_pred local_98;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar16 = (int)CONCAT71(in_register_00000011,second_dash);
  local_204 = iVar16 + SHORT;
  pbVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  pcVar3 = pbVar17[-1]._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar3,pcVar3 + pbVar17[-1]._M_string_length);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  if (iVar16 == 0) {
    bVar10 = detail::split_short(&local_1c0,&local_1e0,&local_200);
    if (!bVar10) {
      pHVar12 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Short parsed but missing! You should not see this","");
      HorribleError::HorribleError(pHVar12,&local_70);
      __cxa_throw(pHVar12,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    bVar10 = detail::split_long(&local_1c0,&local_1e0,&local_178);
    if (!bVar10) {
      pHVar12 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_50,"Long parsed but missing (you should not see this):",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1);
      HorribleError::HorribleError(pHVar12,&local_50);
      __cxa_throw(pHVar12,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var13._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var15._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  paVar2 = &local_98.name.field_2;
  local_98.name._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_1e0._M_dataplus._M_p,
             local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
  local_98.second_dash = second_dash;
  _Var13 = ::std::
           find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                     (_Var13,_Var15,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if (_Var13._M_current ==
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((this->parent_ == (App *)0x0) || (this->fallthrough_ != true)) {
      pbVar17 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar17 + -1;
      pcVar3 = pbVar17[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar17[-1].field_2) {
        operator_delete(pcVar3);
      }
      ::std::
      vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
      ::emplace_back<CLI::detail::Classifer&,std::__cxx11::string&>
                ((vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
                  *)&this->missing_,&local_204,&local_1c0);
    }
    else {
      _parse_arg(this->parent_,args,second_dash);
    }
    goto LAB_0010e146;
  }
  pbVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pbVar17 + -1;
  pcVar3 = pbVar17[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &pbVar17[-1].field_2) {
    operator_delete(pcVar3);
  }
  pOVar4 = ((_Var13._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  uVar18 = pOVar4->expected_;
  if (local_178._M_string_length == 0) {
    if (uVar18 != 0) {
      if ((char *)local_200._M_string_length != (char *)0x0) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,local_200._M_dataplus._M_p,
                   (char *)(local_200._M_string_length + (long)local_200._M_dataplus._M_p));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pOVar4->results_,&local_138);
        pOVar4->callback_run_ = false;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        local_228._0_8_ =
             ((_Var13._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar5._M_current =
             (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                    ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar5,
                     (Option **)local_228);
        }
        else {
          *iVar5._M_current = (Option *)local_228._0_8_;
          pppOVar1 = &(this->parse_order_).
                      super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppOVar1 = *pppOVar1 + 1;
        }
        ::std::__cxx11::string::_M_replace
                  ((ulong)&local_200,0,(char *)local_200._M_string_length,0x11720f);
        uVar18 = uVar18 - (0 < (int)uVar18);
      }
      goto LAB_0010de78;
    }
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pOVar4->results_,&local_118);
    pOVar4->callback_run_ = false;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    local_228._0_8_ =
         ((_Var13._M_current)->_M_t).
         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar5._M_current =
         (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar5,
                 (Option **)local_228);
    }
    else {
      *iVar5._M_current = (Option *)local_228._0_8_;
      pppOVar1 = &(this->parse_order_).
                  super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
  }
  else {
    uVar9 = uVar18 - 1;
    if (uVar18 == 0xffffffff) {
      uVar9 = uVar18;
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_178._M_dataplus._M_p,
               local_178._M_dataplus._M_p + local_178._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pOVar4->results_,&local_f8);
    pOVar4->callback_run_ = false;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    local_228._0_8_ =
         ((_Var13._M_current)->_M_t).
         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar5._M_current =
         (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    uVar18 = uVar9;
    if (iVar5._M_current ==
        (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar5,
                 (Option **)local_228);
    }
    else {
      *iVar5._M_current = (Option *)local_228._0_8_;
      pppOVar1 = &(this->parse_order_).
                  super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
LAB_0010de78:
    if ((int)uVar18 < 0) {
      pbVar17 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start != pbVar17) {
        iVar16 = 0;
        do {
          CVar11 = _recognize(this,pbVar17 + -1);
          if ((CVar11 != NONE) ||
             ((SBORROW4(iVar16,-uVar18) == (int)(iVar16 + uVar18) < 0 &&
              ((sVar14 = _count_remaining_positionals(this,false), sVar14 != 0 ||
               (puVar6 = (this->options_).
                         super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
               _Var15 = ::std::
                        __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>>
                                  ((this->options_).
                                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,puVar6),
               _Var15._M_current != puVar6)))))) break;
          pOVar4 = ((_Var13._M_current)->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          pbVar17 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          pcVar3 = pbVar17[-1]._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_198,pcVar3,pcVar3 + pbVar17[-1]._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pOVar4->results_,&local_198);
          pOVar4->callback_run_ = false;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          local_228._0_8_ =
               ((_Var13._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          iVar5._M_current =
               (this->parse_order_).
               super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::
            _M_realloc_insert<CLI::Option*>
                      ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                       iVar5,(Option **)local_228);
          }
          else {
            *iVar5._M_current = (Option *)local_228._0_8_;
            pppOVar1 = &(this->parse_order_).
                        super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppOVar1 = *pppOVar1 + 1;
          }
          pbVar7 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pbVar17 = pbVar7 + -1;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar17;
          pcVar3 = pbVar7[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &pbVar7[-1].field_2) {
            operator_delete(pcVar3);
            pbVar17 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          }
          iVar16 = iVar16 + 1;
        } while ((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start != pbVar17);
      }
    }
    else if (uVar18 != 0) {
      do {
        pbVar17 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if ((args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == pbVar17) {
          __return_storage_ptr__ = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          Option::single_name_abi_cxx11_
                    (&local_b8,
                     ((_Var13._M_current)->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          pOVar4 = ((_Var13._M_current)->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          _Var8._M_p = (pOVar4->typeval_)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,_Var8._M_p,_Var8._M_p + (pOVar4->typeval_)._M_string_length
                    );
          ArgumentMismatch::TypedAtLeast(__return_storage_ptr__,&local_b8,uVar18,&local_d8);
          __cxa_throw(__return_storage_ptr__,&ArgumentMismatch::typeinfo,Error::~Error);
        }
        pcVar3 = pbVar17[-1]._M_dataplus._M_p;
        local_228._0_8_ = (Option *)(local_228 + 0x10);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,pcVar3,pcVar3 + pbVar17[-1]._M_string_length);
        pbVar17 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar17 + -1;
        pcVar3 = pbVar17[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != &pbVar17[-1].field_2) {
          operator_delete(pcVar3);
        }
        pOVar4 = ((_Var13._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_228._0_8_,(pointer)(local_228._0_8_ + local_228._8_8_)
                  );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pOVar4->results_,&local_158);
        pOVar4->callback_run_ = false;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        local_1a0._M_head_impl =
             ((_Var13._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar5._M_current =
             (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                    ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar5,
                     &local_1a0._M_head_impl);
        }
        else {
          *iVar5._M_current = local_1a0._M_head_impl;
          pppOVar1 = &(this->parse_order_).
                      super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppOVar1 = *pppOVar1 + 1;
        }
        if ((Option *)local_228._0_8_ != (Option *)(local_228 + 0x10)) {
          operator_delete((void *)local_228._0_8_);
        }
        bVar10 = 1 < uVar18;
        uVar18 = uVar18 - 1;
      } while (bVar10);
    }
  }
  if ((char *)local_200._M_string_length != (char *)0x0) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                     "-",&local_200);
    ::std::__cxx11::string::operator=((string *)&local_200,(string *)local_228);
    if ((Option *)local_228._0_8_ != (Option *)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,&local_200);
  }
LAB_0010e146:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void _parse_arg(std::vector<std::string> &args, bool second_dash) {

        detail::Classifer current_type = second_dash ? detail::Classifer::LONG : detail::Classifer::SHORT;

        std::string current = args.back();

        std::string name;
        std::string value;
        std::string rest;

        if(second_dash) {
            if(!detail::split_long(current, name, value))
                throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        } else {
            if(!detail::split_short(current, name, rest))
                throw HorribleError("Short parsed but missing! You should not see this");
        }

        auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [name, second_dash](const Option_p &opt) {
            return second_dash ? opt->check_lname(name) : opt->check_sname(name);
        });

        // Option not found
        if(op_ptr == std::end(options_)) {
            // If a subcommand, try the master command
            if(parent_ != nullptr && fallthrough_)
                return parent_->_parse_arg(args, second_dash);
            // Otherwise, add to missing
            else {
                args.pop_back();
                missing_.emplace_back(current_type, current);
                return;
            }
        }

        args.pop_back();

        // Get a reference to the pointer to make syntax bearable
        Option_p &op = *op_ptr;

        int num = op->get_expected();

        if(!value.empty()) {
            if(num != -1)
                num--;
            op->add_result(value);
            parse_order_.push_back(op.get());
        } else if(num == 0) {
            op->add_result("");
            parse_order_.push_back(op.get());
        } else if(!rest.empty()) {
            if(num > 0)
                num--;
            op->add_result(rest);
            parse_order_.push_back(op.get());
            rest = "";
        }

        // Unlimited vector parser
        if(num < 0) {
            int collected = 0; // Make sure we always eat the minimum
            while(!args.empty() && _recognize(args.back()) == detail::Classifer::NONE) {
                if(collected >= -num) {
                    // We could break here for allow extras, but we don't

                    // If any positionals remain, don't keep eating
                    if(_count_remaining_positionals() > 0)
                        break;

                    // If there are any unlimited positionals, those also take priority
                    if(std::any_of(std::begin(options_), std::end(options_), [](const Option_p &opt) {
                           return opt->get_positional() && opt->get_expected() < 0;
                       }))
                        break;
                }
                op->add_result(args.back());
                parse_order_.push_back(op.get());
                args.pop_back();
                collected++;
            }

        } else {
            while(num > 0 && !args.empty()) {
                num--;
                std::string current_ = args.back();
                args.pop_back();
                op->add_result(current_);
                parse_order_.push_back(op.get());
            }

            if(num > 0) {
                throw ArgumentMismatch::TypedAtLeast(op->single_name(), num, op->get_type_name());
            }
        }

        if(!rest.empty()) {
            rest = "-" + rest;
            args.push_back(rest);
        }
    }